

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::setPatternPartitions
          (BeagleCPUImpl<double,_1,_0> *this,int partitionCount,int *inPatternPartitions)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  thread *ptVar5;
  void *pvVar6;
  undefined8 uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong *puVar11;
  threadData *ptVar12;
  thread *ptVar13;
  threadData *ptVar14;
  void *in_RDX;
  int in_ESI;
  long *in_RDI;
  ulong uVar15;
  int i_6;
  int currentPartition;
  int i_5;
  int contiguousPartitions;
  bool reorderPatterns;
  int i_4;
  int i_3;
  int i_2;
  threadData *td_1;
  int i_1;
  unique_lock<std::mutex> l;
  threadData *td;
  int i;
  int returnCode;
  mutex_type *in_stack_fffffffffffffe98;
  threadData *in_stack_fffffffffffffea0;
  threadData *in_stack_fffffffffffffeb0;
  threadData **in_stack_fffffffffffffec8;
  BeagleCPUImpl<double,_1,_0> **in_stack_fffffffffffffed0;
  thread *in_stack_fffffffffffffed8;
  thread *in_stack_fffffffffffffee0;
  thread *local_118;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_8c;
  int local_60;
  int local_4c;
  int local_3c;
  int local_20;
  int local_1c;
  
  local_1c = 0;
  *(int *)(in_RDI + 9) = in_ESI;
  if ((*(byte *)(in_RDI + 10) & 1) == 0) {
    pvVar6 = malloc((long)*(int *)((long)in_RDI + 0x14) << 2);
    in_RDI[0x11] = (long)pvVar6;
    if (in_RDI[0x11] == 0) {
      uVar7 = __cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc((bad_alloc *)in_stack_fffffffffffffea0);
      __cxa_throw(uVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    if ((*(byte *)((long)in_RDI + 0x13d) & 1) != 0) {
      free((void *)in_RDI[0x2b]);
      if ((*(byte *)((long)in_RDI + 0x13e) & 1) != 0) {
        free((void *)in_RDI[0x2c]);
        free((void *)in_RDI[0x2d]);
        *(undefined1 *)((long)in_RDI + 0x13e) = 0;
      }
      *(undefined1 *)((long)in_RDI + 0x13d) = 0;
    }
  }
  local_118 = in_stack_fffffffffffffed8;
  if (((*(byte *)(in_RDI + 10) & 1) == 0) || (*(int *)((long)in_RDI + 0x4c) < in_ESI)) {
    if ((*(byte *)(in_RDI + 10) & 1) != 0) {
      free((void *)in_RDI[0x12]);
      local_118 = in_stack_fffffffffffffed8;
    }
    pvVar6 = malloc((long)(in_ESI + 1) << 2);
    in_RDI[0x12] = (long)pvVar6;
    if (in_RDI[0x12] == 0) {
      uVar7 = __cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc((bad_alloc *)in_stack_fffffffffffffea0);
      __cxa_throw(uVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    *(int *)((long)in_RDI + 0x4c) = in_ESI;
  }
  if ((*(byte *)((long)in_RDI + 0x13c) & 1) != 0) {
    for (local_20 = 0; local_20 < (int)in_RDI[0x27]; local_20 = local_20 + 1) {
      lVar1 = in_RDI[0x28];
      std::unique_lock<std::mutex>::unique_lock
                ((unique_lock<std::mutex> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      *(undefined1 *)(lVar1 + (long)local_20 * 0xb8 + 0xb0) = 1;
      std::condition_variable::notify_one();
      std::unique_lock<std::mutex>::~unique_lock
                ((unique_lock<std::mutex> *)in_stack_fffffffffffffea0);
    }
    for (local_3c = 0; local_3c < (int)in_RDI[0x27]; local_3c = local_3c + 1) {
      std::thread::join();
    }
    lVar1 = in_RDI[0x28];
    if (lVar1 != 0) {
      for (lVar8 = lVar1 + *(long *)(lVar1 + -8) * 0xb8; lVar1 != lVar8; lVar8 = lVar8 + -0xb8) {
        threadData::~threadData(in_stack_fffffffffffffea0);
      }
      operator_delete__((void *)(lVar1 + -8));
    }
    lVar1 = in_RDI[0x2e];
    if (lVar1 != 0) {
      for (lVar8 = lVar1 + *(long *)(lVar1 + -8) * 0x10; lVar1 != lVar8; lVar8 = lVar8 + -0x10) {
        std::shared_future<void>::~shared_future((shared_future<void> *)0x167797);
      }
      operator_delete__((void *)(lVar1 + -8));
    }
    for (local_4c = 0; local_4c < (int)in_RDI[0x27]; local_4c = local_4c + 1) {
      free(*(void **)(in_RDI[0x29] + (long)local_4c * 8));
    }
    free((void *)in_RDI[0x29]);
    free((void *)in_RDI[0x2a]);
    *(undefined1 *)((long)in_RDI + 0x13c) = 0;
  }
  if ((in_RDI[0xb] & 0x40000000U) != 0) {
    *(int *)(in_RDI + 0x27) = in_ESI;
    uVar9 = (ulong)(int)in_RDI[0x27];
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar9;
    uVar10 = SUB168(auVar2 * ZEXT816(0xb8),0);
    uVar15 = uVar10 + 8;
    if (SUB168(auVar2 * ZEXT816(0xb8),8) != 0 || 0xfffffffffffffff7 < uVar10) {
      uVar15 = 0xffffffffffffffff;
    }
    puVar11 = (ulong *)operator_new__(uVar15);
    *puVar11 = uVar9;
    ptVar13 = (thread *)(puVar11 + 1);
    if (uVar9 != 0) {
      in_stack_fffffffffffffee0 = ptVar13 + uVar9 * 0x17;
      ptVar5 = ptVar13;
      do {
        local_118 = ptVar5;
        threadData::threadData(in_stack_fffffffffffffeb0);
        ptVar5 = local_118 + 0x17;
      } while (local_118 + 0x17 != in_stack_fffffffffffffee0);
    }
    in_RDI[0x28] = (long)ptVar13;
    for (local_60 = 0; local_60 < (int)in_RDI[0x27]; local_60 = local_60 + 1) {
      std::thread::
      thread<void(beagle::cpu::BeagleCPUImpl<double,1,0>::*)(beagle::cpu::BeagleCPUImpl<double,1,0>::threadData*),beagle::cpu::BeagleCPUImpl<double,1,0>*,beagle::cpu::BeagleCPUImpl<double,1,0>::threadData*,void>
                (in_stack_fffffffffffffee0,(type *)local_118,in_stack_fffffffffffffed0,
                 in_stack_fffffffffffffec8);
      std::thread::operator=(&in_stack_fffffffffffffea0->t,(thread *)in_stack_fffffffffffffe98);
      std::thread::~thread((thread *)0x1679ff);
    }
    uVar9 = (ulong)(int)in_RDI[0x27];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar9;
    uVar10 = SUB168(auVar3 * ZEXT816(0x10),0);
    uVar15 = uVar10 + 8;
    if (SUB168(auVar3 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar10) {
      uVar15 = 0xffffffffffffffff;
    }
    puVar11 = (ulong *)operator_new__(uVar15);
    *puVar11 = uVar9;
    ptVar14 = (threadData *)(puVar11 + 1);
    if (uVar9 != 0) {
      ptVar12 = ptVar14;
      do {
        in_stack_fffffffffffffea0 = ptVar12;
        std::shared_future<void>::shared_future((shared_future<void> *)0x167af9);
        ptVar12 = (threadData *)
                  &(in_stack_fffffffffffffea0->jobs).c.
                   super__Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>
                   ._M_impl.super__Deque_impl_data._M_map_size;
      } while (ptVar12 != (threadData *)(&ptVar14->t + uVar9 * 2));
    }
    in_RDI[0x2e] = (long)ptVar14;
    if (in_RDI[0x2e] == 0) {
      uVar7 = __cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc((bad_alloc *)in_stack_fffffffffffffea0);
      __cxa_throw(uVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    pvVar6 = malloc((long)(int)in_RDI[0x27] << 3);
    in_RDI[0x29] = (long)pvVar6;
    for (local_8c = 0; local_8c < (int)in_RDI[0x27]; local_8c = local_8c + 1) {
      pvVar6 = malloc((long)*(int *)((long)in_RDI + 0xc) * 0x24 * (long)in_ESI);
      *(void **)(in_RDI[0x29] + (long)local_8c * 8) = pvVar6;
    }
    pvVar6 = malloc((long)(int)in_RDI[0x27] << 2);
    in_RDI[0x2a] = (long)pvVar6;
    *(undefined1 *)((long)in_RDI + 0x13c) = 1;
  }
  memcpy((void *)in_RDI[0x11],in_RDX,(long)*(int *)((long)in_RDI + 0x14) << 2);
  bVar4 = false;
  local_94 = 0;
  local_98 = 0;
  do {
    if (*(int *)((long)in_RDI + 0x14) <= local_98) {
LAB_00167d18:
      if (bVar4) {
        local_1c = (**(code **)(*in_RDI + 0x200))();
      }
      else {
        local_9c = *(int *)in_RDI[0x11];
        *(undefined4 *)(in_RDI[0x12] + (long)local_9c * 4) = 0;
        for (local_a0 = 0; local_a0 < *(int *)((long)in_RDI + 0x14); local_a0 = local_a0 + 1) {
          if (*(int *)(in_RDI[0x11] + (long)local_a0 * 4) != local_9c) {
            local_9c = *(int *)(in_RDI[0x11] + (long)local_a0 * 4);
            *(int *)(in_RDI[0x12] + (long)local_9c * 4) = local_a0;
          }
        }
        *(undefined4 *)(in_RDI[0x12] + (long)(local_9c + 1) * 4) =
             *(undefined4 *)((long)in_RDI + 0x14);
      }
      *(undefined1 *)(in_RDI + 10) = 1;
      return local_1c;
    }
    if ((0 < local_98) &&
       (*(int *)(in_RDI[0x11] + (long)local_98 * 4) !=
        *(int *)(in_RDI[0x11] + (long)(local_98 + -1) * 4))) {
      local_94 = local_94 + 1;
    }
    if (local_94 != *(int *)(in_RDI[0x11] + (long)local_98 * 4)) {
      bVar4 = true;
      goto LAB_00167d18;
    }
    local_98 = local_98 + 1;
  } while( true );
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setPatternPartitions(int partitionCount,
                                                            const int* inPatternPartitions) {

    int returnCode = BEAGLE_SUCCESS;

    assert(partitionCount > 0);
    assert(inPatternPartitions != 0L);

    kPartitionCount = partitionCount;

    if (!kPartitionsInitialised) {
        gPatternPartitions = (int*) malloc(sizeof(int) * kPatternCount);
        if (gPatternPartitions == NULL)
            throw std::bad_alloc();

        if (kAutoPartitioningEnabled) {
            free(gAutoPartitionOperations);
            if (kAutoRootPartitioningEnabled) {
                free(gAutoPartitionIndices);
                free(gAutoPartitionOutSumLogLikelihoods);
                kAutoRootPartitioningEnabled = false;
            }
            kAutoPartitioningEnabled = false;
        }
    }
    if (!kPartitionsInitialised || partitionCount > kMaxPartitionCount) {
        if (kPartitionsInitialised) {
            free(gPatternPartitionsStartPatterns);
        }
        gPatternPartitionsStartPatterns = (int*) malloc(sizeof(int) * (partitionCount+1));
        if (gPatternPartitionsStartPatterns == NULL)
            throw std::bad_alloc();

        kMaxPartitionCount = partitionCount;
    }

    if (kThreadingEnabled) {
        // Send stop signal to all threads and join them...
        for (int i = 0; i < kNumThreads; i++) {
            threadData* td = &gThreads[i];
            std::unique_lock<std::mutex> l(td->m);
            td->stop = true;
            td->cv.notify_one();
        }

        // Join all the threads
        for (int i = 0; i < kNumThreads; i++) {
            threadData* td = &gThreads[i];
            td->t.join();
        }

        delete[] gThreads;
        delete[] gFutures;

        for (int i=0; i<kNumThreads; i++) {
            free(gThreadOperations[i]);
        }
        free(gThreadOperations);
        free(gThreadOpCounts);

        kThreadingEnabled = false;
    }

    if (kFlags & BEAGLE_FLAG_THREADING_CPP) {
        kNumThreads = partitionCount;

        gThreads = new threadData[kNumThreads];
        for (int i = 0; i < kNumThreads; i++) {
            gThreads[i].t = std::thread(&BeagleCPUImpl<BEAGLE_CPU_GENERIC>::threadWaiting, this, &gThreads[i]);
        }

        gFutures = new std::shared_future<void>[kNumThreads];
        if (gFutures == NULL)
            throw std::bad_alloc();

        gThreadOperations = (int**) malloc(sizeof(int*) * kNumThreads);
        for (int i=0; i<kNumThreads; i++) {
            gThreadOperations[i] = (int*) malloc(sizeof(int) * BEAGLE_PARTITION_OP_COUNT * kBufferCount * partitionCount);
        }

        gThreadOpCounts = (int*) malloc(sizeof(int) * kNumThreads);

        kThreadingEnabled = true;
    }


    memcpy(gPatternPartitions, inPatternPartitions, sizeof(int) * kPatternCount);

    bool reorderPatterns = false;
    int contiguousPartitions = 0;
    for (int i=0; i<kPatternCount; i++) {
        if (i > 0 && (gPatternPartitions[i] != gPatternPartitions[i-1])) {
            contiguousPartitions++;
        }
        if (contiguousPartitions != gPatternPartitions[i]) {
            reorderPatterns = true;
            break;
        }
    }

    if (reorderPatterns) {
        returnCode = reorderPatternsByPartition();
    } else {
        int currentPartition = gPatternPartitions[0];
        gPatternPartitionsStartPatterns[currentPartition] = 0;
        for (int i=0; i<kPatternCount; i++) {
            if (gPatternPartitions[i] != currentPartition) {
                currentPartition = gPatternPartitions[i];
                gPatternPartitionsStartPatterns[currentPartition] = i;
            }
        }
        gPatternPartitionsStartPatterns[currentPartition+1] = kPatternCount;
    }

    kPartitionsInitialised = true;

    return returnCode;
}